

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O1

bool __thiscall
vk::MemoryRequirement::matchesHeap(MemoryRequirement *this,VkMemoryPropertyFlags heapFlags)

{
  uint uVar1;
  
  uVar1 = this->m_flags;
  if ((((heapFlags & 2) == 0 & (byte)uVar1) == 0) &&
     (((heapFlags & 4) == 0 & (byte)((uVar1 & 2) >> 1)) == 0)) {
    return (bool)((byte)((heapFlags & 0x10) >> 4) | (uVar1 & 4) == 0);
  }
  return false;
}

Assistant:

bool MemoryRequirement::matchesHeap (VkMemoryPropertyFlags heapFlags) const
{
	// sanity check
	if ((m_flags & FLAG_COHERENT) && !(m_flags & FLAG_HOST_VISIBLE))
		DE_FATAL("Coherent memory must be host-visible");
	if ((m_flags & FLAG_HOST_VISIBLE) && (m_flags & FLAG_LAZY_ALLOCATION))
		DE_FATAL("Lazily allocated memory cannot be mappable");

	// host-visible
	if ((m_flags & FLAG_HOST_VISIBLE) && !(heapFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT))
		return false;

	// coherent
	if ((m_flags & FLAG_COHERENT) && !(heapFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT))
		return false;

	// lazy
	if ((m_flags & FLAG_LAZY_ALLOCATION) && !(heapFlags & VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT))
		return false;

	return true;
}